

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall
MipsParser::parseRspScalarElement(MipsParser *this,Parser *parser,MipsRegisterValue *dest)

{
  Token *pTVar1;
  int64_t iVar2;
  int64_t local_68;
  string local_60;
  Identifier local_40;
  
  dest->type = RspScalarElement;
  pTVar1 = Parser::nextToken(parser);
  if (((pTVar1->type == LBrack) && (pTVar1 = Parser::nextToken(parser), pTVar1->type == Integer)) &&
     (iVar2 = Token::intValue(pTVar1), iVar2 < 8)) {
    local_68 = Token::intValue(pTVar1);
    tinyformat::format<long>(&local_60,"%d",&local_68);
    Identifier::Identifier(&local_40,&local_60);
    std::__cxx11::string::operator=((string *)&dest->name,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    iVar2 = Token::intValue(pTVar1);
    dest->num = (int)iVar2 + 8;
    pTVar1 = Parser::nextToken(parser);
    return pTVar1->type == RBrack;
  }
  return false;
}

Assistant:

bool MipsParser::parseRspScalarElement(Parser& parser, MipsRegisterValue& dest)
{
	dest.type = MipsRegisterType::RspScalarElement;

	if (parser.nextToken().type != TokenType::LBrack)
		return false;

	const Token &token = parser.nextToken();

	if (token.type != TokenType::Integer || token.intValue() >= 8)
		return false;

	dest.name = Identifier(tfm::format("%d", token.intValue()));
	dest.num = (int)token.intValue() + 8;

	return parser.nextToken().type == TokenType::RBrack;
}